

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

ast * allocast(int nodetype,char *name,YYLTYPE *pos,int num,...)

{
  undefined8 uVar1;
  char in_AL;
  YYLTYPE *pYVar2;
  int in_ECX;
  undefined8 *in_RDX;
  char *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ast *p;
  ast *node;
  va_list ap;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  ast *local_48;
  ast *local_40;
  uint local_38;
  undefined4 local_34;
  undefined8 *local_30;
  undefined1 *local_28;
  int local_1c;
  undefined8 *local_18;
  char *local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_28 = local_f8;
  local_30 = (undefined8 *)&stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x20;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_40 = (ast *)malloc(0x50);
  memset(local_40,0,0x50);
  if (local_40 == (ast *)0x0) {
    err(1,"malloc");
  }
  if (local_18 == (undefined8 *)0x0) {
    local_40->pos = (YYLTYPE *)0x0;
  }
  else {
    pYVar2 = (YYLTYPE *)malloc(0x10);
    local_40->pos = pYVar2;
    if (local_40->pos == (YYLTYPE *)0x0) {
      err(1,"malloc");
    }
    pYVar2 = local_40->pos;
    uVar1 = *local_18;
    pYVar2->first_line = (int)uVar1;
    pYVar2->first_column = (int)((ulong)uVar1 >> 0x20);
    uVar1 = local_18[1];
    pYVar2->last_line = (int)uVar1;
    pYVar2->last_column = (int)((ulong)uVar1 >> 0x20);
  }
  local_40->type = local_4;
  if (local_1c == 0) {
    local_40->left = (ast *)0x0;
  }
  else {
    if (local_38 < 0x29) {
      local_110 = (undefined8 *)(local_28 + (int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_110 = local_30;
      local_30 = local_30 + 1;
    }
    local_40->left = (ast *)*local_110;
  }
  local_48 = local_40->left;
  while (local_1c = local_1c + -1, 0 < local_1c) {
    local_48->parent = local_40;
    if (local_38 < 0x29) {
      local_128 = (undefined8 *)(local_28 + (int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_128 = local_30;
      local_30 = local_30 + 1;
    }
    local_48->right = (ast *)*local_128;
    if (local_48->right != (ast *)0x0) {
      local_48->right->pre = local_48;
    }
    local_48 = local_48->right;
  }
  local_40->name = local_10;
  local_40->filename = cur_file;
  return local_40;
}

Assistant:

struct ast *allocast(int nodetype, const char *name, struct YYLTYPE *pos, int num, ...) {
    va_list ap;
    va_start(ap, num);
    struct ast *node = malloc(sizeof(struct ast));
    memset(node, 0, sizeof(struct ast));
    if (!node)
        err(EXIT_FAILURE, "malloc");
    if (pos) {
        node->pos = malloc(sizeof(struct YYLTYPE));
        if (!node->pos)
            err(EXIT_FAILURE, "malloc");
        *(node->pos) = *pos;
    } else
        node->pos = NULL;
    node->type = nodetype;
    if (num != 0)
        node->left = va_arg(ap, struct ast*);
    else
        node->left = NULL;
    struct ast *p = node->left;
    while (--num > 0) {
        p->parent = node;
        p->right = va_arg(ap, struct ast*);
        if (p->right)
            p->right->pre = p;
        p = p->right;
    }
    va_end(ap);
    node->name = name;
    node->filename = cur_file;
    return node;
}